

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswread.c
# Opt level: O0

int32_t conv_mcnp6_ssw2pdg(int32_t c)

{
  int iVar1;
  int iVar2;
  int local_2c;
  int local_28;
  int32_t p_1;
  int S;
  int Z;
  int A;
  int32_t p;
  int ptype;
  int antibit;
  int32_t c_local;
  int local_4;
  
  if (c < 0) {
    local_4 = 0;
  }
  else {
    iVar1 = (c / 2) % 0x40;
    local_2c = (c / 2) / 0x40;
    if (iVar1 < 0x25) {
      local_28 = conv_mcnp6_to_pdg_0to36[iVar1];
      if ((c % 2 != 0) && (local_28 != 0x16)) {
        local_28 = -local_28;
      }
      local_4 = local_28;
    }
    else if (iVar1 == 0x25) {
      iVar1 = local_2c % 0x200;
      local_2c = local_2c / 0x200;
      iVar2 = local_2c % 0x80;
      local_2c = local_2c / 0x80;
      if ((((iVar1 < 1) || (iVar2 < 1)) || (iVar1 < iVar2)) || (9 < local_2c)) {
        local_4 = 0;
      }
      else {
        local_2c = iVar2 * 10000 + 1000000000 + iVar1 * 10 + local_2c;
        if (c % 2 != 0) {
          local_2c = -local_2c;
        }
        local_4 = local_2c;
      }
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int32_t conv_mcnp6_ssw2pdg( int32_t c )
{
  if (c<0)
    return 0;
  int antibit = c%2;  c /=  2;
  int ptype = c%64;  c /=  64;

  if (ptype<=36) {
    //Note that A (see below) has been observed in SSW files to have non-zero
    //values for ptype<37 as well, so don't require A, Z or S to be 0 here.
    int32_t p = conv_mcnp6_to_pdg_0to36[ptype];
    return (antibit&&p!=22) ? -p : p;
  }
  if (ptype==37) {
    int A = c%512;  c /=  512;
    int Z = c%128;  c /=  128;
    int S = c;
    if (A<1||Z<1||A<Z||S>9)
      return 0;
    int32_t p = 1000000000 + 10000*Z + 10*A + S;
    return antibit ? -p : p;
  }
  return 0;
}